

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

U64 Perft(int depth,game *Game)

{
  bool bVar1;
  U64 UVar2;
  game local_448;
  move local_338;
  undefined2 local_333;
  byte local_331;
  undefined1 local_330 [8];
  arrayMoveList moves;
  U64 nodes;
  game *Game_local;
  undefined4 uStack_10;
  int depth_local;
  
  moves.stackCount = 0;
  moves.iteratorCount = 0;
  if (depth == 0) {
    _uStack_10 = 1;
  }
  else {
    game::generateLegalMoves((arrayMoveList *)local_330,Game);
    arrayMoveList::resetIterator((arrayMoveList *)local_330);
    while( true ) {
      bVar1 = arrayMoveList::next((arrayMoveList *)local_330);
      if (!bVar1) break;
      local_338 = arrayMoveList::getMove((arrayMoveList *)local_330);
      local_333 = local_338._0_2_;
      local_331 = local_338.special;
      game::makeMove(Game,local_338);
      game::game(&local_448,Game);
      UVar2 = Perft(depth + -1,&local_448);
      moves._768_8_ = UVar2 + moves._768_8_;
      game::~game(&local_448);
      game::undoMove(Game);
    }
    uStack_10 = moves.stackCount;
    depth_local = moves.iteratorCount;
  }
  return _uStack_10;
}

Assistant:

U64 Perft(int depth, game Game)
{
    U64 nodes = 0;

    if (depth == 0) return 1;

    arrayMoveList moves = Game.generateLegalMoves();

    moves.resetIterator();
    while(moves.next()) {
      Game.makeMove(moves.getMove());
      nodes += Perft(depth - 1, Game);
      Game.undoMove();
    }
    return nodes;
}